

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Status __thiscall
google::protobuf::DescriptorPool::SetFeatureSetDefaults
          (DescriptorPool *this,FeatureSetDefaults *spec)

{
  bool bVar1;
  Edition EVar2;
  Edition EVar3;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  FeatureSetDefaults *in_RDX;
  AlphaNum *in_R8;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  undefined1 local_440 [56];
  string local_408;
  Edition local_3dc;
  AlphaNum local_3d8;
  AlphaNum local_3a8;
  string local_378;
  AlphaNum local_358;
  AlphaNum local_328;
  string local_2f8;
  undefined1 local_2d8 [16];
  AlphaNum local_2c8;
  string local_298;
  Edition local_274;
  AlphaNum local_270;
  AlphaNum local_240;
  string local_210;
  undefined1 local_1f0 [16];
  FeatureSetDefaults_FeatureSetEditionDefault *local_1e0;
  FeatureSetDefaults_FeatureSetEditionDefault *edition_default;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *__range2;
  undefined1 local_1b8 [4];
  Edition prev_edition;
  string local_188;
  Edition local_15c;
  AlphaNum local_158;
  AlphaNum local_128;
  string local_e8;
  Edition local_c4;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  undefined1 local_40 [16];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  FeatureSetDefaults *spec_local;
  DescriptorPool *this_local;
  
  spec_local = spec;
  this_local = this;
  if ((undefined1  [40])((undefined1  [40])spec[1].field_0 & (undefined1  [40])0x1) ==
      (undefined1  [40])0x0) {
    EVar2 = FeatureSetDefaults::minimum_edition(in_RDX);
    EVar3 = FeatureSetDefaults::maximum_edition(in_RDX);
    if ((int)EVar3 < (int)EVar2) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_90,"Invalid edition range ");
      local_c4 = FeatureSetDefaults::minimum_edition(in_RDX);
      local_e8.field_2._M_allocated_capacity = 0;
      local_e8.field_2._8_8_ = 0;
      local_e8._M_dataplus = (_Alloc_hider)0x0;
      local_e8._1_7_ = 0;
      local_e8._M_string_length = 0;
      absl::lts_20250127::strings_internal::StringifySink::StringifySink((StringifySink *)&local_e8)
      ;
      absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
                (&local_c0,&local_c4,(StringifySink *)&local_e8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_128," to ");
      local_15c = FeatureSetDefaults::maximum_edition(in_RDX);
      local_188.field_2._M_allocated_capacity = 0;
      local_188.field_2._8_8_ = 0;
      local_188._M_dataplus = (_Alloc_hider)0x0;
      local_188._1_7_ = 0;
      local_188._M_string_length = 0;
      absl::lts_20250127::strings_internal::StringifySink::StringifySink
                ((StringifySink *)&local_188);
      absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
                (&local_158,&local_15c,(StringifySink *)&local_188);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_1b8,".");
      absl::lts_20250127::StrCat<>
                (&local_60,&local_90,&local_c0,&local_128,&local_158,(AlphaNum *)local_1b8);
      local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
      message_00._M_str = local_40._0_8_;
      message_00._M_len = (size_t)this;
      absl::lts_20250127::InvalidArgumentError(message_00);
      std::__cxx11::string::~string((string *)&local_60);
      absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                ((StringifySink *)&local_188);
      absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                ((StringifySink *)&local_e8);
    }
    else {
      __range2._4_4_ = EDITION_UNKNOWN;
      this_00 = FeatureSetDefaults::defaults(in_RDX);
      __end2 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::
               begin(this_00);
      edition_default =
           (FeatureSetDefaults_FeatureSetEditionDefault *)
           RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::end
                     (this_00);
      while (bVar1 = internal::operator!=(&__end2,(iterator *)&edition_default), bVar1) {
        local_1e0 = internal::
                    RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                    ::operator*(&__end2);
        EVar2 = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_1e0);
        if (EVar2 == EDITION_UNKNOWN) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_240,"Invalid edition ");
          local_274 = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_1e0);
          local_298.field_2._M_allocated_capacity = 0;
          local_298.field_2._8_8_ = 0;
          local_298._M_dataplus = (_Alloc_hider)0x0;
          local_298._1_7_ = 0;
          local_298._M_string_length = 0;
          absl::lts_20250127::strings_internal::StringifySink::StringifySink
                    ((StringifySink *)&local_298);
          absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
                    (&local_270,&local_274,(StringifySink *)&local_298);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_2c8," specified.");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_210,(lts_20250127 *)&local_240,&local_270,&local_2c8,in_R8);
          local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_210)
          ;
          message_01._M_str = local_1f0._0_8_;
          message_01._M_len = (size_t)this;
          absl::lts_20250127::InvalidArgumentError(message_01);
          std::__cxx11::string::~string((string *)&local_210);
          absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                    ((StringifySink *)&local_298);
          return (Status)(uintptr_t)this;
        }
        EVar2 = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_1e0);
        if ((int)EVar2 <= (int)__range2._4_4_) {
          absl::lts_20250127::AlphaNum::AlphaNum
                    (&local_328,"Feature set defaults are not strictly increasing.  Edition ");
          local_378.field_2._M_allocated_capacity = 0;
          local_378.field_2._8_8_ = 0;
          local_378._M_dataplus = (_Alloc_hider)0x0;
          local_378._1_7_ = 0;
          local_378._M_string_length = 0;
          absl::lts_20250127::strings_internal::StringifySink::StringifySink
                    ((StringifySink *)&local_378);
          absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
                    (&local_358,(Edition *)((long)&__range2 + 4),(StringifySink *)&local_378);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_3a8," is greater than or equal to edition ")
          ;
          local_3dc = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_1e0);
          local_408.field_2._M_allocated_capacity = 0;
          local_408.field_2._8_8_ = 0;
          local_408._M_dataplus = (_Alloc_hider)0x0;
          local_408._1_7_ = 0;
          local_408._M_string_length = 0;
          absl::lts_20250127::strings_internal::StringifySink::StringifySink
                    ((StringifySink *)&local_408);
          absl::lts_20250127::AlphaNum::AlphaNum<google::protobuf::Edition,void>
                    (&local_3d8,&local_3dc,(StringifySink *)&local_408);
          absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)(local_440 + 8),".");
          absl::lts_20250127::StrCat<>
                    (&local_2f8,&local_328,&local_358,&local_3a8,&local_3d8,
                     (AlphaNum *)(local_440 + 8));
          local_2d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2f8)
          ;
          message_02._M_str = local_2d8._0_8_;
          message_02._M_len = (size_t)this;
          absl::lts_20250127::InvalidArgumentError(message_02);
          std::__cxx11::string::~string((string *)&local_2f8);
          absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                    ((StringifySink *)&local_408);
          absl::lts_20250127::strings_internal::StringifySink::~StringifySink
                    ((StringifySink *)&local_378);
          return (Status)(uintptr_t)this;
        }
        __range2._4_4_ = FeatureSetDefaults_FeatureSetEditionDefault::edition(local_1e0);
        internal::
        RepeatedPtrIterator<const_google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::
        operator++(&__end2);
      }
      std::make_unique<google::protobuf::FeatureSetDefaults,google::protobuf::FeatureSetDefaults>
                ((FeatureSetDefaults *)local_440);
      std::
      unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
      ::operator=((unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                   *)(spec + 2),
                  (unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                   *)local_440);
      std::
      unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
      ::~unique_ptr((unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
                     *)local_440);
      absl::lts_20250127::OkStatus();
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,
               "Feature set defaults can\'t be changed once the pool has started building.");
    message._M_str = (char *)local_30._M_len;
    message._M_len = (size_t)this;
    absl::lts_20250127::FailedPreconditionError(message);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status DescriptorPool::SetFeatureSetDefaults(FeatureSetDefaults spec) {
  if (build_started_) {
    return absl::FailedPreconditionError(
        "Feature set defaults can't be changed once the pool has started "
        "building.");
  }
  if (spec.minimum_edition() > spec.maximum_edition()) {
    return absl::InvalidArgumentError(
        absl::StrCat("Invalid edition range ", spec.minimum_edition(), " to ",
                     spec.maximum_edition(), "."));
  }
  Edition prev_edition = EDITION_UNKNOWN;
  for (const auto& edition_default : spec.defaults()) {
    if (edition_default.edition() == EDITION_UNKNOWN) {
      return absl::InvalidArgumentError(absl::StrCat(
          "Invalid edition ", edition_default.edition(), " specified."));
    }
    if (edition_default.edition() <= prev_edition) {
      return absl::InvalidArgumentError(absl::StrCat(
          "Feature set defaults are not strictly increasing.  Edition ",
          prev_edition, " is greater than or equal to edition ",
          edition_default.edition(), "."));
    }
    prev_edition = edition_default.edition();
  }
  feature_set_defaults_spec_ =
      absl::make_unique<FeatureSetDefaults>(std::move(spec));
  return absl::OkStatus();
}